

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn_reader.c
# Opt level: O2

RNNModel * rnnoise_model_from_file(FILE *f)

{
  int iVar1;
  RNNModel *model;
  DenseLayer *pDVar2;
  GRULayer *pGVar3;
  rnn_weight *prVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  int in;
  GRULayer *local_60;
  GRULayer *local_58;
  rnn_weight *local_50;
  DenseLayer *local_48;
  DenseLayer *local_40;
  int local_34;
  
  iVar1 = __isoc99_fscanf(f,"rnnoise-nu model file version %d\n",&in);
  if (((iVar1 == 1) && (in == 1)) && (model = (RNNModel *)calloc(1,0x60), model != (RNNModel *)0x0))
  {
    pDVar2 = (DenseLayer *)calloc(1,0x20);
    if (pDVar2 != (DenseLayer *)0x0) {
      model->input_dense = pDVar2;
      pGVar3 = (GRULayer *)calloc(1,0x28);
      if (pGVar3 != (GRULayer *)0x0) {
        model->vad_gru = pGVar3;
        local_58 = (GRULayer *)calloc(1,0x28);
        if (local_58 != (GRULayer *)0x0) {
          model->noise_gru = local_58;
          local_60 = (GRULayer *)calloc(1,0x28);
          if (local_60 != (GRULayer *)0x0) {
            model->denoise_gru = local_60;
            local_40 = (DenseLayer *)calloc(1,0x20);
            if (local_40 != (DenseLayer *)0x0) {
              model->denoise_output = local_40;
              local_48 = (DenseLayer *)calloc(1,0x20);
              if (local_48 != (DenseLayer *)0x0) {
                model->vad_output = local_48;
                iVar1 = __isoc99_fscanf(f,"%d",&in);
                if ((uint)in < 0x81 && iVar1 == 1) {
                  pDVar2->nb_inputs = in;
                  iVar1 = __isoc99_fscanf(f,"%d",&in);
                  if ((uint)in < 0x81 && iVar1 == 1) {
                    pDVar2->nb_neurons = in;
                    model->input_dense_size = in;
                    iVar1 = __isoc99_fscanf(f,"%d",&in);
                    if ((uint)in < 0x81 && iVar1 == 1) {
                      iVar1 = (uint)(in == 2) * 2;
                      if (in == 1) {
                        iVar1 = 1;
                      }
                      pDVar2->activation = iVar1;
                      iVar1 = pDVar2->nb_inputs;
                      local_34 = pDVar2->nb_neurons;
                      local_50 = (rnn_weight *)malloc((long)(local_34 * iVar1));
                      if (local_50 != (rnn_weight *)0x0) {
                        pDVar2->input_weights = local_50;
                        iVar5 = local_34;
                        for (lVar6 = 0; lVar6 < iVar1 * iVar5; lVar6 = lVar6 + 1) {
                          iVar1 = __isoc99_fscanf(f,"%d",&in);
                          if (iVar1 != 1) goto LAB_0010442b;
                          local_50[lVar6] = (rnn_weight)in;
                          iVar1 = pDVar2->nb_inputs;
                          iVar5 = pDVar2->nb_neurons;
                        }
                        local_50 = (rnn_weight *)malloc((long)iVar5);
                        if (local_50 != (rnn_weight *)0x0) {
                          pDVar2->bias = local_50;
                          for (lVar6 = 0; iVar1 = __isoc99_fscanf(f,"%d",&in), lVar6 < iVar5;
                              lVar6 = lVar6 + 1) {
                            if (iVar1 != 1) goto LAB_0010442b;
                            local_50[lVar6] = (rnn_weight)in;
                            iVar5 = pDVar2->nb_neurons;
                          }
                          if ((uint)in < 0x81 && iVar1 == 1) {
                            pGVar3->nb_inputs = in;
                            iVar1 = __isoc99_fscanf(f,"%d",&in);
                            if ((uint)in < 0x81 && iVar1 == 1) {
                              pGVar3->nb_neurons = in;
                              model->vad_gru_size = in;
                              iVar1 = __isoc99_fscanf(f,"%d",&in);
                              if ((uint)in < 0x81 && iVar1 == 1) {
                                iVar1 = (uint)(in == 2) * 2;
                                if (in == 1) {
                                  iVar1 = 1;
                                }
                                pGVar3->activation = iVar1;
                                iVar1 = pGVar3->nb_inputs;
                                iVar5 = pGVar3->nb_neurons;
                                local_50 = (rnn_weight *)malloc((long)(iVar1 * iVar5 * 3));
                                if (local_50 != (rnn_weight *)0x0) {
                                  pGVar3->input_weights = local_50;
                                  for (lVar6 = 0; lVar6 < iVar1 * iVar5 * 3; lVar6 = lVar6 + 1) {
                                    iVar1 = __isoc99_fscanf(f,"%d",&in);
                                    if (iVar1 != 1) goto LAB_0010442b;
                                    local_50[lVar6] = (rnn_weight)in;
                                    iVar1 = pGVar3->nb_inputs;
                                    iVar5 = pGVar3->nb_neurons;
                                  }
                                  prVar4 = (rnn_weight *)malloc((ulong)(uint)(iVar5 * 3 * iVar5));
                                  if (prVar4 != (rnn_weight *)0x0) {
                                    pGVar3->recurrent_weights = prVar4;
                                    for (uVar7 = 0; uVar7 < (uint)(iVar5 * 3 * iVar5);
                                        uVar7 = uVar7 + 1) {
                                      iVar1 = __isoc99_fscanf(f,"%d",&in);
                                      if (iVar1 != 1) goto LAB_0010442b;
                                      prVar4[uVar7] = (rnn_weight)in;
                                      iVar5 = pGVar3->nb_neurons;
                                    }
                                    prVar4 = (rnn_weight *)malloc((long)(iVar5 * 3));
                                    if (prVar4 != (rnn_weight *)0x0) {
                                      pGVar3->bias = prVar4;
                                      for (lVar6 = 0; iVar1 = __isoc99_fscanf(f,"%d",&in),
                                          lVar6 < iVar5 * 3; lVar6 = lVar6 + 1) {
                                        if (iVar1 != 1) goto LAB_0010442b;
                                        prVar4[lVar6] = (rnn_weight)in;
                                        iVar5 = pGVar3->nb_neurons;
                                      }
                                      if ((uint)in < 0x81 && iVar1 == 1) {
                                        local_58->nb_inputs = in;
                                        iVar1 = __isoc99_fscanf(f,"%d",&in);
                                        if ((uint)in < 0x81 && iVar1 == 1) {
                                          local_58->nb_neurons = in;
                                          model->noise_gru_size = in;
                                          iVar1 = __isoc99_fscanf(f,"%d",&in);
                                          if ((uint)in < 0x81 && iVar1 == 1) {
                                            iVar1 = (uint)(in == 2) * 2;
                                            if (in == 1) {
                                              iVar1 = 1;
                                            }
                                            local_58->activation = iVar1;
                                            iVar1 = local_58->nb_inputs;
                                            iVar5 = local_58->nb_neurons;
                                            prVar4 = (rnn_weight *)malloc((long)(iVar1 * iVar5 * 3))
                                            ;
                                            if (prVar4 != (rnn_weight *)0x0) {
                                              local_58->input_weights = prVar4;
                                              for (lVar6 = 0; lVar6 < iVar1 * iVar5 * 3;
                                                  lVar6 = lVar6 + 1) {
                                                iVar1 = __isoc99_fscanf(f,"%d",&in);
                                                if (iVar1 != 1) goto LAB_0010442b;
                                                prVar4[lVar6] = (rnn_weight)in;
                                                iVar1 = local_58->nb_inputs;
                                                iVar5 = local_58->nb_neurons;
                                              }
                                              prVar4 = (rnn_weight *)
                                                       malloc((ulong)(uint)(iVar5 * 3 * iVar5));
                                              if (prVar4 != (rnn_weight *)0x0) {
                                                local_58->recurrent_weights = prVar4;
                                                for (uVar7 = 0; uVar7 < (uint)(iVar5 * 3 * iVar5);
                                                    uVar7 = uVar7 + 1) {
                                                  iVar1 = __isoc99_fscanf(f,"%d",&in);
                                                  if (iVar1 != 1) goto LAB_0010442b;
                                                  prVar4[uVar7] = (rnn_weight)in;
                                                  iVar5 = local_58->nb_neurons;
                                                }
                                                prVar4 = (rnn_weight *)malloc((long)(iVar5 * 3));
                                                if (prVar4 != (rnn_weight *)0x0) {
                                                  local_58->bias = prVar4;
                                                  for (lVar6 = 0;
                                                      iVar1 = __isoc99_fscanf(f,"%d",&in),
                                                      lVar6 < iVar5 * 3; lVar6 = lVar6 + 1) {
                                                    if (iVar1 != 1) goto LAB_0010442b;
                                                    prVar4[lVar6] = (rnn_weight)in;
                                                    iVar5 = local_58->nb_neurons;
                                                  }
                                                  if ((uint)in < 0x81 && iVar1 == 1) {
                                                    local_60->nb_inputs = in;
                                                    iVar1 = __isoc99_fscanf(f,"%d",&in);
                                                    if ((uint)in < 0x81 && iVar1 == 1) {
                                                      local_60->nb_neurons = in;
                                                      model->denoise_gru_size = in;
                                                      iVar1 = __isoc99_fscanf(f,"%d",&in);
                                                      if ((uint)in < 0x81 && iVar1 == 1) {
                                                        iVar1 = (uint)(in == 2) * 2;
                                                        if (in == 1) {
                                                          iVar1 = 1;
                                                        }
                                                        local_60->activation = iVar1;
                                                        iVar1 = local_60->nb_inputs;
                                                        iVar5 = local_60->nb_neurons;
                                                        prVar4 = (rnn_weight *)
                                                                 malloc((long)(iVar1 * iVar5 * 3));
                                                        if (prVar4 != (rnn_weight *)0x0) {
                                                          local_60->input_weights = prVar4;
                                                          for (lVar6 = 0; lVar6 < iVar1 * iVar5 * 3;
                                                              lVar6 = lVar6 + 1) {
                                                            iVar1 = __isoc99_fscanf(f,"%d",&in);
                                                            if (iVar1 != 1) goto LAB_0010442b;
                                                            prVar4[lVar6] = (rnn_weight)in;
                                                            iVar1 = local_60->nb_inputs;
                                                            iVar5 = local_60->nb_neurons;
                                                          }
                                                          prVar4 = (rnn_weight *)
                                                                   malloc((ulong)(uint)(iVar5 * 3 *
                                                                                       iVar5));
                                                          if (prVar4 != (rnn_weight *)0x0) {
                                                            local_60->recurrent_weights = prVar4;
                                                            for (uVar7 = 0;
                                                                uVar7 < (uint)(iVar5 * 3 * iVar5);
                                                                uVar7 = uVar7 + 1) {
                                                              iVar1 = __isoc99_fscanf(f,"%d",&in);
                                                              if (iVar1 != 1) goto LAB_0010442b;
                                                              prVar4[uVar7] = (rnn_weight)in;
                                                              iVar5 = local_60->nb_neurons;
                                                            }
                                                            prVar4 = (rnn_weight *)
                                                                     malloc((long)(iVar5 * 3));
                                                            if (prVar4 != (rnn_weight *)0x0) {
                                                              local_60->bias = prVar4;
                                                              for (lVar6 = 0;
                                                                  iVar1 = __isoc99_fscanf(f,"%d",&in
                                                                                         ),
                                                                  lVar6 < iVar5 * 3;
                                                                  lVar6 = lVar6 + 1) {
                                                                if (iVar1 != 1) goto LAB_0010442b;
                                                                prVar4[lVar6] = (rnn_weight)in;
                                                                iVar5 = local_60->nb_neurons;
                                                              }
                                                              if ((uint)in < 0x81 && iVar1 == 1) {
                                                                local_40->nb_inputs = in;
                                                                iVar1 = __isoc99_fscanf(f,"%d",&in);
                                                                if ((uint)in < 0x81 && iVar1 == 1) {
                                                                  local_40->nb_neurons = in;
                                                                  model->denoise_output_size = in;
                                                                  iVar1 = __isoc99_fscanf(f,"%d",&in
                                                                                         );
                                                                  if ((uint)in < 0x81 && iVar1 == 1)
                                                                  {
                                                                    iVar1 = (uint)(in == 2) * 2;
                                                                    if (in == 1) {
                                                                      iVar1 = 1;
                                                                    }
                                                                    local_40->activation = iVar1;
                                                                    iVar1 = local_40->nb_inputs;
                                                                    iVar5 = local_40->nb_neurons;
                                                                    prVar4 = (rnn_weight *)
                                                                             malloc((long)(iVar5 * 
                                                  iVar1));
                                                  if (prVar4 != (rnn_weight *)0x0) {
                                                    local_40->input_weights = prVar4;
                                                    for (lVar6 = 0; lVar6 < iVar1 * iVar5;
                                                        lVar6 = lVar6 + 1) {
                                                      iVar1 = __isoc99_fscanf(f,"%d",&in);
                                                      if (iVar1 != 1) goto LAB_0010442b;
                                                      prVar4[lVar6] = (rnn_weight)in;
                                                      iVar1 = local_40->nb_inputs;
                                                      iVar5 = local_40->nb_neurons;
                                                    }
                                                    prVar4 = (rnn_weight *)malloc((long)iVar5);
                                                    if (prVar4 != (rnn_weight *)0x0) {
                                                      local_40->bias = prVar4;
                                                      for (lVar6 = 0;
                                                          iVar1 = __isoc99_fscanf(f,"%d",&in),
                                                          lVar6 < iVar5; lVar6 = lVar6 + 1) {
                                                        if (iVar1 != 1) goto LAB_0010442b;
                                                        prVar4[lVar6] = (rnn_weight)in;
                                                        iVar5 = local_40->nb_neurons;
                                                      }
                                                      if ((uint)in < 0x81 && iVar1 == 1) {
                                                        local_48->nb_inputs = in;
                                                        iVar1 = __isoc99_fscanf(f,"%d",&in);
                                                        if ((uint)in < 0x81 && iVar1 == 1) {
                                                          local_48->nb_neurons = in;
                                                          model->vad_output_size = in;
                                                          iVar1 = __isoc99_fscanf(f,"%d",&in);
                                                          if ((uint)in < 0x81 && iVar1 == 1) {
                                                            iVar1 = (uint)(in == 2) * 2;
                                                            if (in == 1) {
                                                              iVar1 = 1;
                                                            }
                                                            local_48->activation = iVar1;
                                                            iVar1 = local_48->nb_inputs;
                                                            iVar5 = local_48->nb_neurons;
                                                            prVar4 = (rnn_weight *)
                                                                     malloc((long)(iVar5 * iVar1));
                                                            if (prVar4 != (rnn_weight *)0x0) {
                                                              local_48->input_weights = prVar4;
                                                              for (lVar6 = 0; lVar6 < iVar1 * iVar5;
                                                                  lVar6 = lVar6 + 1) {
                                                                iVar1 = __isoc99_fscanf(f,"%d",&in);
                                                                if (iVar1 != 1) goto LAB_0010442b;
                                                                prVar4[lVar6] = (rnn_weight)in;
                                                                iVar1 = local_48->nb_inputs;
                                                                iVar5 = local_48->nb_neurons;
                                                              }
                                                              prVar4 = (rnn_weight *)
                                                                       malloc((long)iVar5);
                                                              if (prVar4 != (rnn_weight *)0x0) {
                                                                local_48->bias = prVar4;
                                                                lVar6 = 0;
                                                                while( true ) {
                                                                  if (iVar5 <= lVar6) {
                                                                    return model;
                                                                  }
                                                                  iVar1 = __isoc99_fscanf(f,"%d",&in
                                                                                         );
                                                                  if (iVar1 != 1) break;
                                                                  prVar4[lVar6] = (rnn_weight)in;
                                                                  lVar6 = lVar6 + 1;
                                                                  iVar5 = local_48->nb_neurons;
                                                                }
                                                              }
                                                            }
                                                          }
                                                        }
                                                      }
                                                    }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
LAB_0010442b:
    rnnoise_model_free(model);
  }
  return (RNNModel *)0x0;
}

Assistant:

RNNModel *rnnoise_model_from_file(FILE *f) {
    int i, in;

    if (fscanf(f, "rnnoise-nu model file version %d\n", &in) != 1 || in != 1)
        return NULL;

    RNNModel *ret = calloc(1, sizeof(RNNModel));
    if (!ret)
        return NULL;

#define ALLOC_LAYER(type, name) \
    type *name; \
    name = calloc(1, sizeof(type)); \
    if (!name) { \
        rnnoise_model_free(ret); \
        return NULL; \
    } \
    ret->name = name

    ALLOC_LAYER(DenseLayer, input_dense);
    ALLOC_LAYER(GRULayer, vad_gru);
    ALLOC_LAYER(GRULayer, noise_gru);
    ALLOC_LAYER(GRULayer, denoise_gru);
    ALLOC_LAYER(DenseLayer, denoise_output);
    ALLOC_LAYER(DenseLayer, vad_output);

#define INPUT_VAL(name) do { \
    if (fscanf(f, "%d", &in) != 1 || in < 0 || in > 128) { \
        rnnoise_model_free(ret); \
        return NULL; \
    } \
    name = in; \
    } while (0)

#define INPUT_ACTIVATION(name) do { \
    int activation; \
    INPUT_VAL(activation); \
    switch (activation) { \
        case F_ACTIVATION_SIGMOID: \
            name = ACTIVATION_SIGMOID; \
            break; \
        case F_ACTIVATION_RELU: \
            name = ACTIVATION_RELU; \
            break; \
        default: \
            name = ACTIVATION_TANH; \
    } \
    } while (0)

#define INPUT_ARRAY(name, len) do { \
    rnn_weight *values = malloc((len) * sizeof(rnn_weight)); \
    if (!values) { \
        rnnoise_model_free(ret); \
        return NULL; \
    } \
    name = values; \
    for (i = 0; i < (len); i++) { \
        if (fscanf(f, "%d", &in) != 1) { \
            rnnoise_model_free(ret); \
            return NULL; \
        } \
        values[i] = in; \
    } \
    } while (0)

#define INPUT_DENSE(name) do { \
    INPUT_VAL(name->nb_inputs); \
    INPUT_VAL(name->nb_neurons); \
    ret->name ## _size = name->nb_neurons; \
    INPUT_ACTIVATION(name->activation); \
    INPUT_ARRAY(name->input_weights, name->nb_inputs * name->nb_neurons); \
    INPUT_ARRAY(name->bias, name->nb_neurons); \
    } while (0)

#define INPUT_GRU(name) do { \
    INPUT_VAL(name->nb_inputs); \
    INPUT_VAL(name->nb_neurons); \
    ret->name ## _size = name->nb_neurons; \
    INPUT_ACTIVATION(name->activation); \
    INPUT_ARRAY(name->input_weights, name->nb_inputs * name->nb_neurons * 3); \
    INPUT_ARRAY(name->recurrent_weights, name->nb_neurons * name->nb_neurons * 3); \
    INPUT_ARRAY(name->bias, name->nb_neurons * 3); \
    } while (0)

    INPUT_DENSE(input_dense);
    INPUT_GRU(vad_gru);
    INPUT_GRU(noise_gru);
    INPUT_GRU(denoise_gru);
    INPUT_DENSE(denoise_output);
    INPUT_DENSE(vad_output);

    return ret;
}